

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O3

bool CDataFileReader::CheckSha256(IOHANDLE Handle,void *pSha256)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  uint uVar5;
  int iVar6;
  undefined1 *puVar7;
  long in_FS_OFFSET;
  SHA256_DIGEST Sha256;
  uchar aBuffer [65536];
  SHA256_CTX Sha256Ctx;
  
  puVar4 = &stack0xffffffffffffffe0;
  do {
    puVar7 = puVar4;
    *(undefined8 *)(puVar7 + -0x1000) = 0;
    puVar4 = puVar7 + -0x1000;
  } while (puVar7 + -0x1000 != aBuffer + 0x78);
  *(undefined8 *)(puVar7 + 0xeff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)(puVar7 + -0x1100) = 0x1be500;
  sha256_init((SHA256_CTX *)(puVar7 + 0xef88));
  *(undefined8 *)(puVar7 + -0x1100) = 0x1be515;
  uVar5 = io_read(Handle,puVar7 + -0x1078,0x10000);
  if (uVar5 != 0) {
    do {
      *(undefined8 *)(puVar7 + -0x1100) = 0x1be536;
      sha256_update((SHA256_CTX *)(puVar7 + 0xef88),puVar7 + -0x1078,(ulong)uVar5);
      *(undefined8 *)(puVar7 + -0x1100) = 0x1be546;
      uVar5 = io_read(Handle,puVar7 + -0x1078,0x10000);
    } while (uVar5 != 0);
  }
  *(undefined8 *)(puVar7 + -0x1100) = 0x1be556;
  io_seek(Handle,0,0);
  *(undefined8 *)(puVar7 + -0x1100) = 0x1be56b;
  sha256_finish((SHA256_DIGEST *)(puVar7 + -0x1098),(SHA256_CTX *)(puVar7 + 0xef88));
  uVar1 = *pSha256;
  uVar2 = *(undefined8 *)((long)pSha256 + 8);
  uVar3 = *(undefined8 *)((long)pSha256 + 0x18);
  *(undefined8 *)(puVar7 + -0x10a8) = *(undefined8 *)((long)pSha256 + 0x10);
  *(undefined8 *)(puVar7 + -0x10a0) = uVar3;
  *(undefined8 *)(puVar7 + -0x10b8) = uVar1;
  *(undefined8 *)(puVar7 + -0x10b0) = uVar2;
  uVar1 = *(undefined8 *)((SHA256_DIGEST *)(puVar7 + -0x1098))->data;
  *(undefined8 *)(puVar7 + -0x10c8) = *(undefined8 *)(puVar7 + -0x1088);
  *(undefined8 *)(puVar7 + -0x10c0) = *(undefined8 *)(puVar7 + -0x1080);
  *(undefined8 *)(puVar7 + -0x10d8) = uVar1;
  *(undefined8 *)(puVar7 + -0x10d0) = *(undefined8 *)(puVar7 + -0x1090);
  *(undefined8 *)(puVar7 + -0x10e8) = *(undefined8 *)(puVar7 + -0x10a8);
  *(undefined8 *)(puVar7 + -0x10e0) = *(undefined8 *)(puVar7 + -0x10a0);
  *(undefined8 *)(puVar7 + -0x10f8) = *(undefined8 *)(puVar7 + -0x10b8);
  *(undefined8 *)(puVar7 + -0x10f0) = *(undefined8 *)(puVar7 + -0x10b0);
  *(undefined8 *)(puVar7 + -0x1100) = 0x1be5a7;
  iVar6 = sha256_comp((SHA256_DIGEST)*(uchar (*) [32])(puVar7 + -0x10f0),
                      (SHA256_DIGEST)*(uchar (*) [32])(puVar7 + -0x10d0));
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(puVar7 + 0xeff8)) {
    return iVar6 == 0;
  }
  *(undefined **)(puVar7 + -0x1100) = &UNK_001be5d3;
  __stack_chk_fail();
}

Assistant:

bool CDataFileReader::CheckSha256(IOHANDLE Handle, const void *pSha256)
{
	// read the hash of the file
	SHA256_CTX Sha256Ctx;
	sha256_init(&Sha256Ctx);
	unsigned char aBuffer[64*1024];
	
	while(1)
	{
		unsigned Bytes = io_read(Handle, aBuffer, sizeof(aBuffer));
		if(Bytes == 0)
			break;
		sha256_update(&Sha256Ctx, aBuffer, Bytes);
	}

	io_seek(Handle, 0, IOSEEK_START);
	SHA256_DIGEST Sha256 = sha256_finish(&Sha256Ctx);

	return !sha256_comp(*(const SHA256_DIGEST *)pSha256, Sha256);
}